

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void stdout_callback(log_Event *ev)

{
  FILE *__stream;
  size_t sVar1;
  char *pcVar2;
  char local_28 [8];
  char buf [16];
  log_Event *ev_local;
  
  sVar1 = strftime(local_28,0x10,"%H:%M:%S",(tm *)ev->time);
  local_28[sVar1] = '\0';
  __stream = (FILE *)ev->udata;
  pcVar2 = get_level_string(ev->level);
  fprintf(__stream,"%s %-7s %s:%d: ",local_28,pcVar2,ev->file,(ulong)(uint)ev->line);
  vfprintf((FILE *)ev->udata,ev->fmt,ev);
  fprintf((FILE *)ev->udata,"\n");
  fflush((FILE *)ev->udata);
  return;
}

Assistant:

static void stdout_callback(log_Event *ev) {
    char buf[16];
    buf[strftime(buf, sizeof(buf), "%H:%M:%S", ev->time)] = '\0';
#ifdef LOG_USE_COLOR
    fprintf(ev->udata, "%s %s%-7s\x1b[0m \x1b[90m%s:%d:\x1b[0m ", buf,
            get_level_color(ev->level), get_level_string(ev->level), ev->file,
            ev->line);
#else
    fprintf(ev->udata, "%s %-7s %s:%d: ", buf, get_level_string(ev->level),
            ev->file, ev->line);
#endif
    vfprintf(ev->udata, ev->fmt, ev->ap);
    fprintf(ev->udata, "\n");
    fflush(ev->udata);
}